

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O1

bool __thiscall
burst::
subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
::equal(subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
        *this,subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
              *that)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  pointer p_Var4;
  pointer p_Var5;
  long lVar6;
  bool bVar7;
  
  if ((this->m_begin)._M_node != (that->m_begin)._M_node) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                  ,0x83,
                  "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
                 );
  }
  if ((this->m_end)._M_node == (that->m_end)._M_node) {
    lVar3 = this->m_subsequence_size;
    if (lVar3 == that->m_subsequence_size) {
      if (lVar3 == 0) {
        return lVar3 == 0;
      }
      p_Var4 = (this->m_subsequence).
               super__Vector_base<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 = (that->m_subsequence).
               super__Vector_base<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (p_Var4->_M_node == p_Var5->_M_node) {
        lVar6 = 8;
        do {
          bVar7 = lVar3 << 3 == lVar6;
          if (bVar7) {
            return bVar7;
          }
          plVar1 = (long *)((long)&p_Var4->_M_node + lVar6);
          plVar2 = (long *)((long)&p_Var5->_M_node + lVar6);
          lVar6 = lVar6 + 8;
        } while (*plVar1 == *plVar2);
      }
    }
    return false;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                ,0x84,
                "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
               );
}

Assistant:

bool equal (const subsequence_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subsequence_begin(), this->subsequence_end(),
                    that.subsequence_begin(), that.subsequence_end()
                );
        }